

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# grid.cpp
# Opt level: O0

void __thiscall NetworkNS::Grid::Grid(Grid *this,double Lx,double Ly,double Lz,int nx,int ny,int nz)

{
  grid_cell *pgVar1;
  int iVar2;
  int local_68;
  int c_id;
  int iupper;
  int ilower;
  int jupper;
  int jlower;
  int kupper;
  int klower;
  int kcell;
  int jcell;
  int icell;
  int i;
  int j;
  int k;
  int counter;
  int nz_local;
  int ny_local;
  int nx_local;
  double Lz_local;
  double Ly_local;
  double Lx_local;
  Grid *this_local;
  
  this->_vptr_Grid = (_func_int **)&PTR__Grid_00125d30;
  this->ncellx = nx;
  this->ncelly = ny;
  this->ncellz = nz;
  this->ncells = this->ncellx * this->ncelly * this->ncellz;
  pgVar1 = (grid_cell *)malloc((long)this->ncells * 0x90);
  this->cells = pgVar1;
  this->dlx = Lx / (double)this->ncellx;
  this->idlx = 1.0 / this->dlx;
  this->dly = Ly / (double)this->ncelly;
  this->idly = 1.0 / this->dly;
  this->dlz = Lz / (double)this->ncellz;
  this->idlz = 1.0 / this->dlz;
  this->vcell = this->dlx * this->dly * this->dlz;
  this->ivcell = 1.0 / this->vcell;
  j = 0;
  for (i = 0; i < this->ncellz; i = i + 1) {
    for (icell = 0; icell < this->ncelly; icell = icell + 1) {
      for (jcell = 0; jcell < this->ncellx; jcell = jcell + 1) {
        this->cells[j].Id = i * this->ncelly * this->ncellx + icell * this->ncellx + jcell;
        this->cells[j].Vec[0] = (double)(jcell + 1) * this->dlx;
        this->cells[j].Vec[1] = (double)(icell + 1) * this->dly;
        this->cells[j].Vec[2] = (double)(i + 1) * this->dlz;
        j = j + 1;
      }
    }
  }
  for (kupper = 0; kupper < this->ncellz; kupper = kupper + 1) {
    jupper = kupper + 1;
    if (this->ncellz + -1 < kupper + 1) {
      jupper = 0;
    }
    iVar2 = kupper;
    if (kupper + -1 < 0) {
      iVar2 = this->ncellz;
    }
    jlower = iVar2 + -1;
    for (klower = 0; klower < this->ncelly; klower = klower + 1) {
      iupper = klower + 1;
      if (this->ncelly + -1 < klower + 1) {
        iupper = 0;
      }
      iVar2 = klower;
      if (klower + -1 < 0) {
        iVar2 = this->ncelly;
      }
      ilower = iVar2 + -1;
      for (kcell = 0; kcell < this->ncellx; kcell = kcell + 1) {
        local_68 = kcell + 1;
        if (this->ncellx + -1 < kcell + 1) {
          local_68 = 0;
        }
        iVar2 = kcell;
        if (kcell + -1 < 0) {
          iVar2 = this->ncellx;
        }
        c_id = iVar2 + -1;
        iVar2 = kupper * this->ncelly * this->ncellx + klower * this->ncellx + kcell;
        this->cells[iVar2].neigh[0] =
             kupper * this->ncelly * this->ncellx + klower * this->ncellx + kcell;
        this->cells[iVar2].neigh[1] =
             kupper * this->ncelly * this->ncellx + klower * this->ncellx + local_68;
        this->cells[iVar2].neigh[2] =
             kupper * this->ncelly * this->ncellx + klower * this->ncellx + c_id;
        this->cells[iVar2].neigh[3] =
             kupper * this->ncelly * this->ncellx + iupper * this->ncellx + kcell;
        this->cells[iVar2].neigh[4] =
             kupper * this->ncelly * this->ncellx + ilower * this->ncellx + kcell;
        this->cells[iVar2].neigh[5] =
             kupper * this->ncelly * this->ncellx + iupper * this->ncellx + local_68;
        this->cells[iVar2].neigh[6] =
             kupper * this->ncelly * this->ncellx + iupper * this->ncellx + c_id;
        this->cells[iVar2].neigh[7] =
             kupper * this->ncelly * this->ncellx + ilower * this->ncellx + local_68;
        this->cells[iVar2].neigh[8] =
             kupper * this->ncelly * this->ncellx + ilower * this->ncellx + c_id;
        this->cells[iVar2].neigh[9] =
             jupper * this->ncelly * this->ncellx + klower * this->ncellx + kcell;
        this->cells[iVar2].neigh[10] =
             jupper * this->ncelly * this->ncellx + klower * this->ncellx + local_68;
        this->cells[iVar2].neigh[0xb] =
             jupper * this->ncelly * this->ncellx + klower * this->ncellx + c_id;
        this->cells[iVar2].neigh[0xc] =
             jupper * this->ncelly * this->ncellx + iupper * this->ncellx + kcell;
        this->cells[iVar2].neigh[0xd] =
             jupper * this->ncelly * this->ncellx + ilower * this->ncellx + kcell;
        this->cells[iVar2].neigh[0xe] =
             jupper * this->ncelly * this->ncellx + iupper * this->ncellx + local_68;
        this->cells[iVar2].neigh[0xf] =
             jupper * this->ncelly * this->ncellx + iupper * this->ncellx + c_id;
        this->cells[iVar2].neigh[0x10] =
             jupper * this->ncelly * this->ncellx + ilower * this->ncellx + local_68;
        this->cells[iVar2].neigh[0x11] =
             jupper * this->ncelly * this->ncellx + ilower * this->ncellx + c_id;
        this->cells[iVar2].neigh[0x12] =
             jlower * this->ncelly * this->ncellx + klower * this->ncellx + kcell;
        this->cells[iVar2].neigh[0x13] =
             jlower * this->ncelly * this->ncellx + klower * this->ncellx + local_68;
        this->cells[iVar2].neigh[0x14] =
             jlower * this->ncelly * this->ncellx + klower * this->ncellx + c_id;
        this->cells[iVar2].neigh[0x15] =
             jlower * this->ncelly * this->ncellx + iupper * this->ncellx + kcell;
        this->cells[iVar2].neigh[0x16] =
             jlower * this->ncelly * this->ncellx + ilower * this->ncellx + kcell;
        this->cells[iVar2].neigh[0x17] =
             jlower * this->ncelly * this->ncellx + iupper * this->ncellx + local_68;
        this->cells[iVar2].neigh[0x18] =
             jlower * this->ncelly * this->ncellx + iupper * this->ncellx + c_id;
        this->cells[iVar2].neigh[0x19] =
             jlower * this->ncelly * this->ncellx + ilower * this->ncellx + local_68;
        this->cells[iVar2].neigh[0x1a] =
             jlower * this->ncelly * this->ncellx + ilower * this->ncellx + c_id;
      }
    }
  }
  return;
}

Assistant:

Grid::Grid(double Lx, double Ly, double Lz, int nx, int ny, int nz) {

      /* Initialize the arrays with the cells: */
      ncellx = nx;
      ncelly = ny;
      ncellz = nz;
      ncells = ncellx * ncelly * ncellz;
      cells = (grid_cell*)malloc(ncells * sizeof(grid_cell));

      /*define dlx, dly, dlz and vecell: all of these are common parameters for each subcell
       *  and thus they are defined only once*/

      dlx = Lx / double(ncellx);
      idlx = 1.0 / dlx;
      dly = Ly / double(ncelly);
      idly = 1.0 / dly;
      dlz = Lz / double(ncellz);
      idlz = 1.0 / dlz;
      vcell = dlx * dly*dlz;
      ivcell = 1.0 / vcell;

      int counter = 0;
      //define Id, and the vector of each cell

      for (int k = 0; k < ncellz; k++) 

         for (int j = 0; j < ncelly; j++) 

            for (int i = 0; i < ncellx; i++) {


               cells[counter].Id = k * ncelly * ncellx + j * ncellx + i;
               cells[counter].Vec[0] = double(i + 1) * dlx;
               cells[counter].Vec[1] = double(j + 1) * dly;
               cells[counter].Vec[2] = double(k + 1) * dlz;


              
               counter = counter + 1;
            }

         

      

      //define the first neighbours of all nodes 


      int icell, jcell, kcell, klower, kupper, jlower, jupper, ilower, iupper, c_id;

      for (kcell = 0; kcell < ncellz; kcell++) {

         kupper = kcell + 1;
         if ((kcell + 1)>(ncellz - 1)) kupper = 0;
         klower = kcell - 1;
         if ((kcell - 1) < 0) klower = ncellz - 1;

         for (jcell = 0; jcell < ncelly; jcell++) {

            jupper = jcell + 1;
            if ((jcell + 1)>(ncelly - 1)) jupper = 0;
            jlower = jcell - 1;
            if ((jcell - 1) < 0) jlower = ncelly - 1;


            for (icell = 0; icell < ncellx; icell++) {

               iupper = icell + 1;
               if ((icell + 1)>(ncellx - 1)) iupper = 0;
               ilower = icell - 1;
               if ((icell - 1) < 0) ilower = ncellx - 1;

               c_id = (kcell) * ncelly * ncellx + (jcell) * ncellx + icell;

               // 1: z, y , x:
               //neigh[cell_id][0] = (kcell)*ncelly*ncellx + (jcell)*ncellx + icell;
               cells[c_id].neigh[0] = (kcell) * ncelly * ncellx + (jcell) * ncellx + icell;
               //2: same z, same y, x+
               //neigh[cell_id][1] = (kcell)*ncelly*ncellx + (jcell)*ncellx + iupper;
               cells[c_id].neigh[1] = (kcell) * ncelly * ncellx + (jcell) * ncellx + iupper;
               // 3: same z, same y, x-
               //neigh[cell_id][2] = (kcell)*ncelly*ncellx + (jcell)*ncellx + ilower;  
               cells[c_id].neigh[2] = (kcell) * ncelly * ncellx + (jcell) * ncellx + ilower;
               //4: same z, y+ , same x
               //neigh[cell_id][3] = (kcell)*ncelly*ncellx + (jupper)*ncellx + icell; 
               cells[c_id].neigh[3] = (kcell) * ncelly * ncellx + (jupper) * ncellx + icell;
               //5: same z, y- , same x
               //neigh[cell_id][4] = (kcell)*ncelly*ncellx + (jlower)*ncellx + icell;
               cells[c_id].neigh[4] = (kcell) * ncelly * ncellx + (jlower) * ncellx + icell;
               //6: same z, y+ , x+
               //neigh[cell_id][5] = (kcell)*ncelly*ncellx + (jupper)*ncellx + iupper;
               cells[c_id].neigh[5] = (kcell) * ncelly * ncellx + (jupper) * ncellx + iupper;
               //7: same z, y+ , x-
               //neigh[cell_id][6] = (kcell)*ncelly*ncellx + (jupper)*ncellx + ilower;
               cells[c_id].neigh[6] = (kcell) * ncelly * ncellx + (jupper) * ncellx + ilower;
               //8: same z, y-, x+
               //neigh[cell_id][7] = (kcell)*ncelly*ncellx + (jlower)*ncellx + iupper;
               cells[c_id].neigh[7] = (kcell) * ncelly * ncellx + (jlower) * ncellx + iupper;
               //9: same z, y-, x-
               //neigh[cell_id][8] = (kcell)*ncelly*ncellx + (jlower)*ncellx + ilower;
               cells[c_id].neigh[8] = (kcell) * ncelly * ncellx + (jlower) * ncellx + ilower;

               //10: z+1, y, x :
               //neigh[cell_id][9] = (kupper)*ncelly*ncellx + (jcell)*ncellx + icell;
               cells[c_id].neigh[9] = (kupper) * ncelly * ncellx + (jcell) * ncellx + icell;
               //11: z+1, same y, x+
               //neigh[cell_id][10] = (kupper)*ncelly*ncellx + (jcell)*ncellx + iupper;
               cells[c_id].neigh[10] = (kupper) * ncelly * ncellx + (jcell) * ncellx + iupper;
               //12: z+1, same y, x-
               //neigh[cell_id][11] = (kupper)*ncelly*ncellx + (jcell)*ncellx + ilower;
               cells[c_id].neigh[11] = (kupper) * ncelly * ncellx + (jcell) * ncellx + ilower;
               //13: z+1, y+ , same x
               //neigh[cell_id][12] = (kupper)*ncelly*ncellx + (jupper)*ncellx + icell;
               cells[c_id].neigh[12] = (kupper) * ncelly * ncellx + (jupper) * ncellx + icell;
               //14: z+1, y- , same x
               //neigh[cell_id][13] = (kupper)*ncelly*ncellx + (jlower)*ncellx + icell;
               cells[c_id].neigh[13] = (kupper) * ncelly * ncellx + (jlower) * ncellx + icell;
               //15: z+1, y+ , x+
               //neigh[cell_id][14] = (kupper)*ncelly*ncellx + (jupper)*ncellx + iupper;
               cells[c_id].neigh[14] = (kupper) * ncelly * ncellx + (jupper) * ncellx + iupper;
               //16: z+1, y+ , x-
               //neigh[cell_id][15] = (kupper)*ncelly*ncellx + (jupper)*ncellx + ilower;
               cells[c_id].neigh[15] = (kupper) * ncelly * ncellx + (jupper) * ncellx + ilower;
               //17: z+1, y-, x+
               //neigh[cell_id][16] = (kupper)*ncelly*ncellx + (jlower)*ncellx + iupper;
               cells[c_id].neigh[16] = (kupper) * ncelly * ncellx + (jlower) * ncellx + iupper;
               //18: z+1, y-, x-
               //neigh[cell_id][17] = (kupper)*ncelly*ncellx + (jlower)*ncellx + ilower;
               cells[c_id].neigh[17] = (kupper) * ncelly * ncellx + (jlower) * ncellx + ilower;

               //19: z-1, y, x :
               //neigh[cell_id][18] = (klower)*ncelly*ncellx + (jcell)*ncellx + icell;
               cells[c_id].neigh[18] = (klower) * ncelly * ncellx + (jcell) * ncellx + icell;
               //20: z-1, same y, x+
               //neigh[cell_id][19] = (klower)*ncelly*ncellx + (jcell)*ncellx + iupper;
               cells[c_id].neigh[19] = (klower) * ncelly * ncellx + (jcell) * ncellx + iupper;
               //21: z-1, same y, x-
               //neigh[cell_id][20] = (klower)*ncelly*ncellx + (jcell)*ncellx + ilower;
               cells[c_id].neigh[20] = (klower) * ncelly * ncellx + (jcell) * ncellx + ilower;
               //22: z-1, y+ , same x
               //neigh[cell_id][21] = (klower)*ncelly*ncellx + (jupper)*ncellx + icell;
               cells[c_id].neigh[21] = (klower) * ncelly * ncellx + (jupper) * ncellx + icell;
               //23: z-1, y- , same x
               //neigh[cell_id][22] = (klower)*ncelly*ncellx + (jlower)*ncellx + icell;
               cells[c_id].neigh[22] = (klower) * ncelly * ncellx + (jlower) * ncellx + icell;
               //24: z-1, y+ , x+
               //neigh[cell_id][23] = (klower)*ncelly*ncellx + (jupper)*ncellx + iupper;
               cells[c_id].neigh[23] = (klower) * ncelly * ncellx + (jupper) * ncellx + iupper;
               //25: z-1, y+ , x-
               //neigh[cell_id][24] = (klower)*ncelly*ncellx + (jupper)*ncellx + ilower;
               cells[c_id].neigh[24] = (klower) * ncelly * ncellx + (jupper) * ncellx + ilower;
               //26: z-1, y-, x+
               //neigh[cell_id][25] = (klower)*ncelly*ncellx + (jlower)*ncellx + iupper;
               cells[c_id].neigh[25] = (klower) * ncelly * ncellx + (jlower) * ncellx + iupper;
               //27: z-1, y-, x-
               //neigh[cell_id][26] = (klower)*ncelly*ncellx + (jlower)*ncellx + ilower;
               cells[c_id].neigh[26] = (klower) * ncelly * ncellx + (jlower) * ncellx + ilower;

            }

         }

      }



   }